

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

int gen_publickey_from_ecdsa_openssh_priv_data
              (LIBSSH2_SESSION *session,libssh2_curve_type curve_type,string_buf *decrypted,
              uchar **method,size_t *method_len,uchar **pubkeydata,size_t *pubkeydata_len,
              EVP_PKEY **ec_ctx)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  EVP_PKEY_CTX *ctx;
  size_t sVar4;
  void *__dest;
  EVP_PKEY *ec_key;
  int local_134;
  uchar *exponent;
  size_t exponentlen;
  uchar *point_buf;
  size_t pointlen;
  size_t curvelen;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined8 local_e8;
  uchar *curve;
  undefined1 local_d8 [40];
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  undefined4 local_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined8 local_40;
  
  ec_key = (EVP_PKEY *)0x0;
  pcVar3 = (char *)EC_curve_nid2nist(curve_type);
  iVar1 = _libssh2_get_string(decrypted,&curve,&curvelen);
  if ((iVar1 == 0) && (curvelen != 0)) {
    iVar1 = _libssh2_get_string(decrypted,&point_buf,&pointlen);
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_bignum_bytes(decrypted,&exponent,&exponentlen);
      if (iVar1 == 0) {
        if (pcVar3 == (char *)0x0) {
          return -1;
        }
        ctx = EVP_PKEY_CTX_new_id(0x198,(ENGINE *)0x0);
        if (ctx != (EVP_PKEY_CTX *)0x0) {
          sVar4 = strlen(pcVar3);
          __dest = (void *)CRYPTO_zalloc(sVar4 + 1,
                                         "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/src/openssl.c"
                                         ,0xdf4);
          if (__dest != (void *)0x0) {
            sVar4 = strlen(pcVar3);
            memcpy(__dest,pcVar3,sVar4);
            _libssh2_swap_bytes(exponent,exponentlen);
            OSSL_PARAM_construct_utf8_string(local_d8,"group",__dest,0);
            OSSL_PARAM_construct_octet_string(&local_108,"pub",point_buf,pointlen);
            local_90 = local_e8;
            local_a0 = local_f8;
            uStack_9c = uStack_f4;
            uStack_98 = uStack_f0;
            uStack_94 = uStack_ec;
            local_b0 = local_108;
            uStack_ac = uStack_104;
            uStack_a8 = uStack_100;
            uStack_a4 = uStack_fc;
            OSSL_PARAM_construct_BN(&local_108,"priv",exponent,exponentlen);
            local_68 = local_e8;
            local_78 = local_f8;
            uStack_74 = uStack_f4;
            uStack_70 = uStack_f0;
            uStack_6c = uStack_ec;
            local_88 = local_108;
            uStack_84 = uStack_104;
            uStack_80 = uStack_100;
            uStack_7c = uStack_fc;
            OSSL_PARAM_construct_end(&local_108);
            local_40 = local_e8;
            local_50 = local_f8;
            uStack_4c = uStack_f4;
            uStack_48 = uStack_f0;
            uStack_44 = uStack_ec;
            local_60 = local_108;
            uStack_5c = uStack_104;
            uStack_58 = uStack_100;
            uStack_54 = uStack_fc;
            iVar1 = EVP_PKEY_fromdata_init(ctx);
            if (0 < iVar1) {
              local_134 = EVP_PKEY_fromdata(ctx,&ec_key,0x87,local_d8);
              uVar2 = (uint)(local_134 != 1);
              sVar4 = strlen(pcVar3);
              CRYPTO_clear_free(__dest,sVar4,
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/palmin[P]libssh2/src/openssl.c"
                                ,0xe0e);
              if ((((method != (uchar **)0x0) && (pubkeydata != (uchar **)0x0)) && (local_134 == 1))
                 && (ec_key != (EVP_PKEY *)0x0)) {
                uVar2 = gen_publickey_from_ec_evp
                                  (session,method,method_len,pubkeydata,pubkeydata_len,0,ec_key);
              }
              EVP_PKEY_CTX_free(ctx);
              if (ec_ctx == (EVP_PKEY **)0x0) {
                EVP_PKEY_free((EVP_PKEY *)ec_key);
                return uVar2;
              }
              *ec_ctx = ec_key;
              return uVar2;
            }
          }
          EVP_PKEY_CTX_free(ctx);
          return 0;
        }
        return 0;
      }
      pcVar3 = "ECDSA no exponent";
    }
    else {
      pcVar3 = "ECDSA no point";
    }
  }
  else {
    pcVar3 = "ECDSA no curve";
  }
  _libssh2_error(session,-0xe,pcVar3);
  return -1;
}

Assistant:

static int
gen_publickey_from_ecdsa_openssh_priv_data(LIBSSH2_SESSION *session,
                                           libssh2_curve_type curve_type,
                                           struct string_buf *decrypted,
                                           unsigned char **method,
                                           size_t *method_len,
                                           unsigned char **pubkeydata,
                                           size_t *pubkeydata_len,
                                           libssh2_ecdsa_ctx **ec_ctx)
{
    int rc = 0;
    size_t curvelen, exponentlen, pointlen;
    unsigned char *curve, *exponent, *point_buf;
    libssh2_ecdsa_ctx *ec_key = NULL;

#ifdef USE_OPENSSL_3
    EVP_PKEY_CTX *fromdata_ctx = NULL;
    OSSL_PARAM params[4];
    const char *n = EC_curve_nid2nist(curve_type);
    char *group_name = NULL;
#else
    BIGNUM *bn_exponent;
#endif

    _libssh2_debug((session,
                   LIBSSH2_TRACE_AUTH,
                   "Computing ECDSA keys from private key data"));

    if(_libssh2_get_string(decrypted, &curve, &curvelen) ||
        curvelen == 0) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no curve");
        return -1;
    }

    if(_libssh2_get_string(decrypted, &point_buf, &pointlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no point");
        return -1;
    }

    if(_libssh2_get_bignum_bytes(decrypted, &exponent, &exponentlen)) {
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA no exponent");
        return -1;
    }

#ifdef USE_OPENSSL_3
    if(!n)
        return -1;

    fromdata_ctx = EVP_PKEY_CTX_new_id(EVP_PKEY_EC, NULL);

    if(!fromdata_ctx)
        goto fail;

    group_name = OPENSSL_zalloc(strlen(n) + 1);

    if(!group_name)
        goto fail;

    memcpy(group_name, n, strlen(n));
    _libssh2_swap_bytes(exponent, (unsigned long)exponentlen);

    params[0] = OSSL_PARAM_construct_utf8_string(OSSL_PKEY_PARAM_GROUP_NAME,
                                                 group_name, 0);

    params[1] = OSSL_PARAM_construct_octet_string(OSSL_PKEY_PARAM_PUB_KEY,
                                                  point_buf, pointlen);

    params[2] = OSSL_PARAM_construct_BN(OSSL_PKEY_PARAM_PRIV_KEY, exponent,
                                        exponentlen);

    params[3] = OSSL_PARAM_construct_end();

    if(EVP_PKEY_fromdata_init(fromdata_ctx) <= 0)
        goto fail;

    rc = EVP_PKEY_fromdata(fromdata_ctx, &ec_key, EVP_PKEY_KEYPAIR, params);
    rc = rc != 1;

    if(group_name)
        OPENSSL_clear_free(group_name, strlen(n));
#else
    rc = _libssh2_ecdsa_curve_name_with_octal_new(&ec_key,
                                                  point_buf, pointlen,
                                                  curve_type);
    if(rc) {
        rc = -1;
        _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                       "ECDSA could not create key");
        goto fail;
    }

    bn_exponent = BN_new();
    if(!bn_exponent) {
        rc = -1;
        _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                       "Unable to allocate memory for private key data");
        goto fail;
    }

    BN_bin2bn(exponent, (int) exponentlen, bn_exponent);
    rc = (EC_KEY_set_private_key(ec_key, bn_exponent) != 1);
#endif

    if(rc == 0 && ec_key && pubkeydata && method) {
#ifdef USE_OPENSSL_3
        EVP_PKEY *pk = ec_key;
#else
        EVP_PKEY *pk = EVP_PKEY_new();
        EVP_PKEY_set1_EC_KEY(pk, ec_key);
#endif

        rc = gen_publickey_from_ec_evp(session, method, method_len,
                                       pubkeydata, pubkeydata_len,
                                       0, pk);

#ifndef USE_OPENSSL_3
        if(pk)
            EVP_PKEY_free(pk);
#endif
    }

#ifdef USE_OPENSSL_3
    if(fromdata_ctx)
        EVP_PKEY_CTX_free(fromdata_ctx);
#endif

    if(ec_ctx)
        *ec_ctx = ec_key;
    else
        _libssh2_ecdsa_free(ec_key);

    return rc;

fail:
#ifdef USE_OPENSSL_3
    if(fromdata_ctx)
        EVP_PKEY_CTX_free(fromdata_ctx);
#endif

    if(ec_key)
        _libssh2_ecdsa_free(ec_key);

    return rc;
}